

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_pkey.c
# Opt level: O0

OSSL_DECODER_CTX *
OSSL_DECODER_CTX_new_for_pkey
          (EVP_PKEY **pkey,char *input_type,char *input_structure,char *keytype,int selection,
          OSSL_LIB_CTX *libctx,char *propquery)

{
  int iVar1;
  BIO *trc_out_1;
  BIO *trc_out;
  OSSL_DECODER_CTX *ctx;
  undefined4 in_stack_00000028;
  OSSL_DECODER_CTX *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  OSSL_DECODER_CTX *local_8;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_8 = OSSL_DECODER_CTX_new();
  if (local_8 == (OSSL_DECODER_CTX *)0x0) {
    ERR_new();
    ERR_set_debug((char *)local_8,iVar1,in_stack_ffffffffffffffb0);
    ERR_set_error(0x3c,0xc0100,(char *)0x0);
    local_8 = (OSSL_DECODER_CTX *)0x0;
  }
  else {
    iVar1 = OSSL_DECODER_CTX_set_input_type(in_stack_ffffffffffffffa8,(char *)0x40ca9a);
    if ((((iVar1 == 0) ||
         (iVar1 = OSSL_DECODER_CTX_set_input_structure(in_stack_ffffffffffffffa8,(char *)0x40caae),
         iVar1 == 0)) ||
        (iVar1 = OSSL_DECODER_CTX_set_selection(in_stack_ffffffffffffffa8,0), iVar1 == 0)) ||
       ((iVar1 = ossl_decoder_ctx_setup_for_pkey
                           ((OSSL_DECODER_CTX *)keytype,
                            (EVP_PKEY **)CONCAT44(selection,in_stack_00000028),(char *)libctx,
                            (OSSL_LIB_CTX *)ctx,(char *)trc_out), iVar1 == 0 ||
        (iVar1 = OSSL_DECODER_CTX_add_extra
                           ((OSSL_DECODER_CTX *)input_structure,(OSSL_LIB_CTX *)keytype,
                            (char *)CONCAT44(selection,in_stack_00000028)), iVar1 == 0)))) {
      OSSL_DECODER_CTX_free((OSSL_DECODER_CTX *)0x40cb23);
      local_8 = (OSSL_DECODER_CTX *)0x0;
    }
  }
  return local_8;
}

Assistant:

OSSL_DECODER_CTX *
OSSL_DECODER_CTX_new_for_pkey(EVP_PKEY **pkey,
                              const char *input_type,
                              const char *input_structure,
                              const char *keytype, int selection,
                              OSSL_LIB_CTX *libctx, const char *propquery)
{
    OSSL_DECODER_CTX *ctx = NULL;

    if ((ctx = OSSL_DECODER_CTX_new()) == NULL) {
        ERR_raise(ERR_LIB_OSSL_DECODER, ERR_R_MALLOC_FAILURE);
        return NULL;
    }

    OSSL_TRACE_BEGIN(DECODER) {
        BIO_printf(trc_out,
                   "(ctx %p) Looking for %s decoders with selection %d\n",
                   (void *)ctx, keytype, selection);
        BIO_printf(trc_out, "    input type: %s, input structure: %s\n",
                   input_type, input_structure);
    } OSSL_TRACE_END(DECODER);

    if (OSSL_DECODER_CTX_set_input_type(ctx, input_type)
        && OSSL_DECODER_CTX_set_input_structure(ctx, input_structure)
        && OSSL_DECODER_CTX_set_selection(ctx, selection)
        && ossl_decoder_ctx_setup_for_pkey(ctx, pkey, keytype,
                                           libctx, propquery)
        && OSSL_DECODER_CTX_add_extra(ctx, libctx, propquery)) {
        OSSL_TRACE_BEGIN(DECODER) {
            BIO_printf(trc_out, "(ctx %p) Got %d decoders\n",
                       (void *)ctx, OSSL_DECODER_CTX_get_num_decoders(ctx));
        } OSSL_TRACE_END(DECODER);
        return ctx;
    }

    OSSL_DECODER_CTX_free(ctx);
    return NULL;
}